

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar4;
  bool is_wide_string;
  char **haystack_local;
  char **needle_local;
  bool expected_to_be_substring_local;
  char *local_40;
  AssertionResult local_38;
  char *local_28;
  char *begin_string_quote;
  char *haystack_expr_local;
  char *needle_expr_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  needle_expr_local = *(char **)(in_FS_OFFSET + 0x28);
  begin_string_quote = haystack_expr;
  haystack_expr_local = needle_expr;
  bVar1 = anon_unknown_28::IsSubstringPred(*needle,*haystack);
  if (bVar1 == expected_to_be_substring) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    local_28 = "\"";
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_38,(char (*) [11])"Value of: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&haystack_expr_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1eac02);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x1ea54e);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_28);
    pAVar2 = AssertionResult::operator<<(pAVar2,needle);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x1eaf38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x1ea55a);
    local_40 = "not ";
    if (expected_to_be_substring) {
      local_40 = "";
    }
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_40);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"a substring of ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&begin_string_quote);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1eac02);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x1ea51b);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_28);
    pAVar2 = AssertionResult::operator<<(pAVar2,haystack);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1eaf25);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    AssertionResult::~AssertionResult(&local_38);
    sVar3.ptr_ = extraout_RDX;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == needle_expr_local) {
    AVar4.message_.ptr_ = sVar3.ptr_;
    AVar4._0_8_ = this;
    return AVar4;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}